

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineVertexUtil.cpp
# Opt level: O2

vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *
vkt::pipeline::createOverlappingQuads(void)

{
  ulong uVar1;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *in_RDI;
  Vector<float,_4> *v;
  int quadNdx;
  long lVar2;
  float local_138;
  float fStack_134;
  value_type local_118;
  value_type local_f8;
  ulong local_d8 [4];
  value_type local_b8;
  value_type local_98;
  Vector<float,_4> local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined1 *puStack_50;
  undefined8 local_48;
  undefined1 *puStack_40;
  
  (in_RDI->
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8[0] = 0xbe800000be800000;
  local_d8[1] = 0xbe800000bf800000;
  local_d8[2] = 0xbf800000bf800000;
  local_d8[3] = 0xbf800000be800000;
  v = &local_78;
  local_78.m_data[0] = 1.0;
  local_78.m_data[1] = 0.0;
  local_78.m_data[2] = 0.0;
  local_78.m_data[3] = 1.0;
  local_68 = 0x3f80000000000000;
  uStack_60 = 0x3f80000000000000;
  local_58 = 0;
  puStack_50 = &DAT_3f8000003f800000;
  local_48 = 0x3f800000;
  puStack_40 = &DAT_3f8000003f800000;
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    uVar1 = local_d8[lVar2];
    local_98.position.m_data[2] = 0.0;
    local_98.position.m_data[0] = (float)(int)uVar1;
    local_98.position.m_data[1] = (float)(int)(uVar1 >> 0x20);
    local_98.position.m_data[3] = 1.0;
    tcu::Vector<float,_4>::Vector(&local_98.color,v);
    local_138 = (float)uVar1;
    fStack_134 = (float)(uVar1 >> 0x20);
    local_f8.position.m_data[0] = local_138;
    local_f8.position.m_data[2] = 0.0;
    local_f8.position.m_data[3] = 1.0;
    local_f8.position.m_data[1] = fStack_134 + 1.25;
    tcu::Vector<float,_4>::Vector(&local_f8.color,v);
    local_118.position.m_data[1] = fStack_134;
    local_118.position.m_data[2] = 0.0;
    local_118.position.m_data[3] = 1.0;
    local_118.position.m_data[0] = local_138 + 1.25;
    tcu::Vector<float,_4>::Vector(&local_118.color,v);
    local_b8.position.m_data[2] = 0.0;
    local_b8.position.m_data[3] = 1.0;
    local_b8.position.m_data[0] = local_138 + 1.25;
    local_b8.position.m_data[1] = fStack_134 + 1.25;
    tcu::Vector<float,_4>::Vector(&local_b8.color,v);
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
              (in_RDI,&local_98);
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
              (in_RDI,&local_118);
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
              (in_RDI,&local_f8);
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
              (in_RDI,&local_118);
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
              (in_RDI,&local_f8);
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
              (in_RDI,&local_b8);
    v = v + 1;
  }
  return in_RDI;
}

Assistant:

std::vector<Vertex4RGBA> createOverlappingQuads (void)
{
	using tcu::Vec2;
	using tcu::Vec4;

	std::vector<Vertex4RGBA> vertices;

	const Vec2 translations[4] =
	{
		Vec2(-0.25f, -0.25f),
		Vec2(-1.0f, -0.25f),
		Vec2(-1.0f, -1.0f),
		Vec2(-0.25f, -1.0f)
	};

	const Vec4 quadColors[4] =
	{
		Vec4(1.0f, 0.0f, 0.0f, 1.0),
		Vec4(0.0f, 1.0f, 0.0f, 1.0),
		Vec4(0.0f, 0.0f, 1.0f, 1.0),
		Vec4(1.0f, 0.0f, 1.0f, 1.0)
	};

	const float quadSize = 1.25f;

	for (int quadNdx = 0; quadNdx < 4; quadNdx++)
	{
		const Vec2&	translation	= translations[quadNdx];
		const Vec4&	color		= quadColors[quadNdx];

		const Vertex4RGBA lowerLeftVertex =
		{
			Vec4(translation.x(), translation.y(), 0.0f, 1.0f),
			color
		};
		const Vertex4RGBA upperLeftVertex =
		{
			Vec4(translation.x(), translation.y() + quadSize, 0.0f, 1.0f),
			color
		};
		const Vertex4RGBA lowerRightVertex =
		{
			Vec4(translation.x() + quadSize, translation.y(), 0.0f, 1.0f),
			color
		};
		const Vertex4RGBA upperRightVertex =
		{
			Vec4(translation.x() + quadSize, translation.y() + quadSize, 0.0f, 1.0f),
			color
		};

		// Triangle 1, CCW
		vertices.push_back(lowerLeftVertex);
		vertices.push_back(lowerRightVertex);
		vertices.push_back(upperLeftVertex);

		// Triangle 2, CW
		vertices.push_back(lowerRightVertex);
		vertices.push_back(upperLeftVertex);
		vertices.push_back(upperRightVertex);
	}

	return vertices;
}